

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.h
# Opt level: O0

void __thiscall
uWS::HttpContext<false>::onHttp
          (HttpContext<false> *this,string *method,string *pattern,
          unique_function<void_(HttpResponse<false>_*,_HttpRequest_*)> *handler,bool upgrade)

{
  bool bVar1;
  string *in_RDX;
  string *in_RSI;
  byte in_R8B;
  uint32_t unaff_retaddr;
  unique_function<bool_(HttpRouter<RouterData>_*)> *in_stack_00000008;
  string *in_stack_00000010;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000018;
  HttpRouter<uWS::HttpContextData<false>::RouterData> *in_stack_00000020;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  methods;
  HttpContextData<false> *httpContextData;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  anon_class_32_1_aca58a2a_for_value_ *in_stack_fffffffffffffeb8;
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>_*)>_>
  *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffed8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  string local_c8 [56];
  string *local_90;
  string local_88 [32];
  string *local_68;
  undefined8 local_60;
  HttpContextData<false> *local_30;
  byte local_21;
  
  local_21 = in_R8B & 1;
  local_30 = getSocketContextData((HttpContext<false> *)0x24573a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x24574f);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else {
    local_90 = local_88;
    std::__cxx11::string::string(local_90,in_RSI);
    local_68 = local_88;
    local_60 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffed8 = (string *)&local_68;
    do {
      in_stack_fffffffffffffed8 = in_stack_fffffffffffffed8 + -0x20;
      std::__cxx11::string::~string(in_stack_fffffffffffffed8);
    } while (in_stack_fffffffffffffed8 != local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDX,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffed8);
  std::__cxx11::string::string(local_c8,in_RDX);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
  ::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
              *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
              *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>_*)>_>
  ::
  function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]typing_battles_incppect_third_party_uWebSockets_src_HttpContext_h:362:55),_nullptr,_nullptr,_nullptr,_nullptr>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                  (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  HttpRouter<uWS::HttpContextData<false>::RouterData>::add
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>_*)>_>
  ::~function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>_*)>_>
               *)0x2459e1);
  onHttp(std::__cxx11::string,std::__cxx11::string,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::HttpResponse<false>*,uWS::HttpRequest*)>>&&,bool)
  ::{lambda(auto:1*)#1}::~function((anon_class_32_1_aca58a2a_for_value_ *)0x2459eb);
  std::__cxx11::string::~string(local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffea0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffea0);
  return;
}

Assistant:

void onHttp(std::string method, std::string pattern, fu2::unique_function<void(HttpResponse<SSL> *, HttpRequest *)> &&handler, bool upgrade = false) {
        HttpContextData<SSL> *httpContextData = getSocketContextData();

        /* Todo: This is ugly, fix */
        std::vector<std::string> methods;
        if (method == "*") {
            methods = httpContextData->router.methods;
        } else {
            methods = {method};
        }

        httpContextData->router.add(methods, pattern, [handler = std::move(handler)](auto *r) mutable {
            auto user = r->getUserData();
            user.httpRequest->setYield(false);
            user.httpRequest->setParameters(r->getParameters());

            /* Middleware? Automatically respond to expectations */
            std::string_view expect = user.httpRequest->getHeader("expect");
            if (expect.length() && expect == "100-continue") {
                user.httpResponse->writeContinue();
            }

            handler(user.httpResponse, user.httpRequest);

            /* If any handler yielded, the router will keep looking for a suitable handler. */
            if (user.httpRequest->getYield()) {
                return false;
            }
            return true;
        }, method == "*" ? httpContextData->router.LOW_PRIORITY : (upgrade ? httpContextData->router.HIGH_PRIORITY : httpContextData->router.MEDIUM_PRIORITY));
    }